

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hn-state.cpp
# Opt level: O0

void anon_unknown.dwarf_216a9::replaceAll(string *s,string *search,string *replace)

{
  string *psVar1;
  ulong in_RSI;
  string *in_RDI;
  size_t pos;
  
  while( true ) {
    psVar1 = (string *)std::__cxx11::string::find(in_RDI,in_RSI);
    if (psVar1 == (string *)0xffffffffffffffff) break;
    std::__cxx11::string::length();
    std::__cxx11::string::erase((ulong)in_RDI,(ulong)psVar1);
    std::__cxx11::string::insert((ulong)in_RDI,psVar1);
    std::__cxx11::string::length();
  }
  return;
}

Assistant:

void replaceAll(std::string & s, const std::string & search, const std::string & replace) {
        for (size_t pos = 0; ; pos += replace.length()) {
            pos = s.find(search, pos);
            if (pos == std::string::npos) break;
            s.erase(pos, search.length());
            s.insert(pos, replace);
        }
    }